

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_sse2_intrinsics.c
# Opt level: O1

void png_read_filter_row_avg4_sse2(png_row_infop row_info,png_bytep row,png_const_bytep prev)

{
  byte *pbVar1;
  undefined4 uVar2;
  ulong uVar3;
  long lVar4;
  char cVar5;
  byte bVar6;
  char cVar7;
  byte bVar8;
  char cVar9;
  byte bVar10;
  char cVar11;
  byte bVar12;
  char cVar13;
  byte bVar14;
  char cVar15;
  byte bVar16;
  char cVar17;
  byte bVar18;
  char cVar19;
  byte bVar20;
  char cVar21;
  byte bVar22;
  char cVar23;
  byte bVar24;
  char cVar25;
  byte bVar26;
  char cVar27;
  byte bVar28;
  char cVar29;
  byte bVar30;
  char cVar31;
  byte bVar32;
  char cVar33;
  byte bVar34;
  char cVar35;
  byte bVar36;
  
  uVar3 = row_info->rowbytes + 4;
  if (4 < uVar3) {
    bVar6 = 0;
    bVar8 = 0;
    bVar10 = 0;
    bVar12 = 0;
    bVar14 = 0;
    bVar16 = 0;
    bVar18 = 0;
    bVar20 = 0;
    bVar22 = 0;
    bVar24 = 0;
    bVar26 = 0;
    bVar28 = 0;
    bVar30 = 0;
    bVar32 = 0;
    bVar34 = 0;
    bVar36 = 0;
    lVar4 = 0;
    do {
      pbVar1 = prev + lVar4;
      uVar2 = *(undefined4 *)(row + lVar4);
      cVar5 = pavgb(bVar6,*pbVar1);
      cVar7 = pavgb(bVar8,pbVar1[1]);
      cVar9 = pavgb(bVar10,pbVar1[2]);
      cVar11 = pavgb(bVar12,pbVar1[3]);
      cVar13 = pavgb(bVar14,0);
      cVar15 = pavgb(bVar16,0);
      cVar17 = pavgb(bVar18,0);
      cVar19 = pavgb(bVar20,0);
      cVar21 = pavgb(bVar22,0);
      cVar23 = pavgb(bVar24,0);
      cVar25 = pavgb(bVar26,0);
      cVar27 = pavgb(bVar28,0);
      cVar29 = pavgb(bVar30,0);
      cVar31 = pavgb(bVar32,0);
      cVar33 = pavgb(bVar34,0);
      cVar35 = pavgb(bVar36,0);
      bVar14 = cVar13 - (bVar14 & 1);
      bVar16 = cVar15 - (bVar16 & 1);
      bVar18 = cVar17 - (bVar18 & 1);
      bVar20 = cVar19 - (bVar20 & 1);
      bVar22 = cVar21 - (bVar22 & 1);
      bVar24 = cVar23 - (bVar24 & 1);
      bVar26 = cVar25 - (bVar26 & 1);
      bVar28 = cVar27 - (bVar28 & 1);
      bVar30 = cVar29 - (bVar30 & 1);
      bVar32 = cVar31 - (bVar32 & 1);
      bVar34 = cVar33 - (bVar34 & 1);
      bVar36 = cVar35 - (bVar36 & 1);
      bVar6 = (cVar5 - ((bVar6 ^ *pbVar1) & 1)) + (char)uVar2;
      bVar8 = (cVar7 - ((bVar8 ^ pbVar1[1]) & 1)) + (char)((uint)uVar2 >> 8);
      bVar10 = (cVar9 - ((bVar10 ^ pbVar1[2]) & 1)) + (char)((uint)uVar2 >> 0x10);
      bVar12 = (cVar11 - ((bVar12 ^ pbVar1[3]) & 1)) + (char)((uint)uVar2 >> 0x18);
      pbVar1 = row + lVar4;
      *pbVar1 = bVar6;
      pbVar1[1] = bVar8;
      pbVar1[2] = bVar10;
      pbVar1[3] = bVar12;
      uVar3 = uVar3 - 4;
      lVar4 = lVar4 + 4;
    } while (4 < uVar3);
  }
  return;
}

Assistant:

void png_read_filter_row_avg4_sse2(png_row_infop row_info, png_bytep row,
   png_const_bytep prev)
{
   /* The Avg filter predicts each pixel as the (truncated) average of a and b.
    * There's no pixel to the left of the first pixel.  Luckily, it's
    * predicted to be half of the pixel above it.  So again, this works
    * perfectly with our loop if we make sure a starts at zero.
    */
   size_t rb;
   const __m128i zero = _mm_setzero_si128();
   __m128i    b;
   __m128i a, d = zero;

   png_debug(1, "in png_read_filter_row_avg4_sse2");

   rb = row_info->rowbytes+4;
   while (rb > 4) {
      __m128i avg;
             b = load4(prev);
      a = d; d = load4(row );

      /* PNG requires a truncating average, so we can't just use _mm_avg_epu8 */
      avg = _mm_avg_epu8(a,b);
      /* ...but we can fix it up by subtracting off 1 if it rounded up. */
      avg = _mm_sub_epi8(avg, _mm_and_si128(_mm_xor_si128(a,b),
                                            _mm_set1_epi8(1)));

      d = _mm_add_epi8(d, avg);
      store4(row, d);

      prev += 4;
      row  += 4;
      rb   -= 4;
   }
}